

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

void duckdb_yyjson::pool_free(void *ctx_ptr,void *ptr)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  pool_ctx *ctx;
  ulong *puVar4;
  
  plVar1 = (long *)((long)ptr - 0x10);
  plVar3 = (long *)0x0;
  puVar4 = (ulong *)((long)ctx_ptr + 8);
  do {
    plVar2 = plVar3;
    plVar3 = (long *)*puVar4;
    if (plVar3 == (long *)0x0) break;
    puVar4 = (ulong *)(plVar3 + 1);
  } while (plVar3 < plVar1);
  puVar4 = (ulong *)(plVar2 + 1);
  if (plVar2 == (long *)0x0) {
    puVar4 = (ulong *)((long)ctx_ptr + 8);
  }
  *puVar4 = (ulong)plVar1;
  *(long **)((long)ptr + -8) = plVar3;
  if (plVar3 == (long *)0x0) {
    plVar3 = (long *)0x0;
  }
  else if ((long *)((long)plVar1 + *plVar1) == plVar3) {
    *(long *)((long)ptr + -0x10) = *plVar1 + *plVar3;
    plVar3 = (long *)plVar3[1];
    *(long **)((long)ptr + -8) = plVar3;
  }
  if ((plVar2 != (long *)0x0) && ((long *)((long)plVar2 + *plVar2) == plVar1)) {
    *plVar2 = *plVar2 + *plVar1;
    plVar2[1] = (long)plVar3;
    return;
  }
  return;
}

Assistant:

static void pool_free(void *ctx_ptr, void *ptr) {
    /* assert(ptr != NULL) */
    pool_ctx *ctx = (pool_ctx *)ctx_ptr;
    pool_chunk *cur = ((pool_chunk *)ptr) - 1;
    pool_chunk *prev = NULL, *next = ctx->free_list;

    while (next && next < cur) {
        prev = next;
        next = next->next;
    }
    if (prev) prev->next = cur;
    else ctx->free_list = cur;
    cur->next = next;

    if (next && ((u8 *)cur + cur->size) == (u8 *)next) {
        /* merge cur to higher chunk */
        cur->size += next->size;
        cur->next = next->next;
    }
    if (prev && ((u8 *)prev + prev->size) == (u8 *)cur) {
        /* merge cur to lower chunk */
        prev->size += cur->size;
        prev->next = cur->next;
    }
}